

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
vkt::shaderexecutor::Functions::CompMatFuncBase<2,_3>::doApply
          (IRet *__return_storage_ptr__,CompMatFuncBase<2,_3> *this,EvalContext *ctx,IArgs *iargs)

{
  Interval *pIVar1;
  IRet *pIVar2;
  bool bVar3;
  long *plVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  undefined1 local_82;
  undefined1 local_81;
  IRet *local_80;
  long local_78;
  EvalContext *local_70;
  Interval *local_68;
  Interval *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  local_80 = __return_storage_ptr__;
  local_70 = ctx;
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix(__return_storage_ptr__);
  lVar5 = 0;
  do {
    pIVar2 = local_80;
    lVar7 = 0;
    bVar3 = true;
    local_78 = lVar5;
    do {
      bVar6 = bVar3;
      plVar4 = (long *)(**(code **)(*(long *)this + 0x58))(this);
      local_68 = (iargs->a->m_data).m_data[lVar5].m_data + lVar7;
      local_60 = (iargs->b->m_data).m_data[lVar5].m_data + lVar7;
      local_58 = &local_81;
      local_50 = &local_82;
      (**(code **)(*plVar4 + 0x40))(&local_48,plVar4,local_70,&local_68);
      (pIVar2->m_data).m_data[lVar5].m_data[lVar7].m_hi = local_38;
      pIVar1 = (pIVar2->m_data).m_data[lVar5].m_data + lVar7;
      *(undefined8 *)pIVar1 = local_48;
      pIVar1->m_lo = dStack_40;
      lVar7 = 1;
      bVar3 = false;
    } while (bVar6);
    lVar5 = local_78 + 1;
  } while (lVar5 != 3);
  return local_80;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet			ret;

		for (int col = 0; col < Cols; ++col)
		{
			for (int row = 0; row < Rows; ++row)
				ret[col][row] = this->doGetScalarFunc().apply(ctx,
															  iargs.a[col][row],
															  iargs.b[col][row]);
		}

		return ret;
	}